

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationData::addLowScriptRange
          (CollationData *this,uint8_t *table,int32_t index,int32_t lowStart)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = (long)index;
  uVar1 = this->scriptStarts[lVar2];
  uVar3 = lowStart + 0x100;
  if ((lowStart & 0xffU) <= (uVar1 & 0xff)) {
    uVar3 = lowStart;
  }
  table[lVar2] = (uint8_t)(uVar3 >> 8);
  return this->scriptStarts[lVar2 + 1] & 0xff |
         ((this->scriptStarts[lVar2 + 1] & 0xff00) - (uVar1 & 0xff00)) + (uVar3 & 0xff00);
}

Assistant:

int32_t
CollationData::addLowScriptRange(uint8_t table[], int32_t index, int32_t lowStart) const {
    int32_t start = scriptStarts[index];
    if((start & 0xff) < (lowStart & 0xff)) {
        lowStart += 0x100;
    }
    table[index] = (uint8_t)(lowStart >> 8);
    int32_t limit = scriptStarts[index + 1];
    lowStart = ((lowStart & 0xff00) + ((limit & 0xff00) - (start & 0xff00))) | (limit & 0xff);
    return lowStart;
}